

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateLdHomeObj(Lowerer *this,Instr *instr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  Lowerer *baseOpnd;
  undefined4 *puVar4;
  Opnd *pOVar5;
  IndirOpnd *pIVar6;
  BranchInstr *pBVar7;
  JITTimeFunctionBody *pJVar8;
  RegOpnd *dst;
  Lowerer *this_00;
  LabelInstr *pLVar9;
  int32 offset;
  LabelInstr *instr_00;
  Opnd *local_68;
  Opnd *functionObjOpnd;
  Func *local_58;
  LabelInstr *local_50;
  Opnd *local_48;
  LabelInstr *local_40;
  LabelInstr *local_38;
  
  pFVar1 = instr->m_func;
  local_50 = IR::LabelInstr::New(Label,pFVar1,false);
  local_40 = IR::LabelInstr::New(Label,pFVar1,false);
  local_38 = IR::LabelInstr::New(Label,pFVar1,false);
  local_38->m_name = L"ScriptFunctionWithHomeObj";
  functionObjOpnd = LoadLibraryValueOpnd(this,instr,ValueUndefined);
  local_58 = pFVar1;
  baseOpnd = (Lowerer *)IR::RegOpnd::New(TyUint64,pFVar1);
  pOVar5 = instr->m_dst;
  bVar3 = IR::Opnd::IsRegOpnd(pOVar5);
  local_48 = pOVar5;
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x642c,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  InsertMove(local_48,functionObjOpnd,instr,true);
  local_68 = (Opnd *)0x0;
  LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,instr,&local_68);
  InsertMove((Opnd *)baseOpnd,local_68,instr,true);
  pOVar5 = LoadVTableValueOpnd(this,instr,VtableStackScriptFunction);
  pFVar1 = local_58;
  this_00 = baseOpnd;
  pIVar6 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,local_58,false);
  pLVar9 = local_50;
  pBVar7 = InsertCompareBranch(this_00,&pIVar6->super_Opnd,pOVar5,BrEq_A,true,local_50,instr,false);
  LowererMD::InsertObjectPoison((Opnd *)baseOpnd,pBVar7,instr,false);
  pJVar8 = Func::GetJITFunctionBody(pFVar1);
  bVar3 = JITTimeFunctionBody::HasHomeObj(pJVar8);
  if (bVar3) {
    pJVar8 = Func::GetJITFunctionBody(pFVar1);
    bVar3 = JITTimeFunctionBody::IsCoroutine(pJVar8);
    if (bVar3) {
      offset = 0x50;
      pLVar9 = local_38;
    }
    else {
      dst = IR::RegOpnd::New(TyUint8,instr->m_func);
      pIVar6 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x40,TyUint8,instr->m_func,false);
      InsertMove(&dst->super_Opnd,&pIVar6->super_Opnd,instr,true);
      pLVar9 = local_38;
      pBVar7 = InsertTestBranch(&dst->super_Opnd,&dst->super_Opnd,BrEq_A,local_38,instr);
      LowererMD::InsertObjectPoison((Opnd *)baseOpnd,pBVar7,instr,false);
      offset = 0x70;
    }
    pJVar8 = Func::GetJITFunctionBody(pFVar1);
    JITTimeFunctionBody::HasComputedName(pJVar8);
    pIVar6 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,offset,TyUint64,pFVar1,false);
    InsertMove((Opnd *)baseOpnd,&pIVar6->super_Opnd,instr,true);
    instr_00 = local_40;
    InsertBranch(Br,local_40,instr);
    IR::Instr::InsertBefore(instr,&pLVar9->super_Instr);
    pIVar6 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x48,TyUint64,pFVar1,false);
    InsertMove((Opnd *)baseOpnd,&pIVar6->super_Opnd,instr,true);
    pLVar9 = local_50;
  }
  else {
    InsertBranch(Br,pLVar9,instr);
    instr_00 = local_40;
  }
  IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
  InsertTestBranch((Opnd *)baseOpnd,(Opnd *)baseOpnd,BrEq_A,pLVar9,instr);
  InsertMove(local_48,(Opnd *)baseOpnd,instr,true);
  IR::Instr::InsertBefore(instr,&pLVar9->super_Instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateLdHomeObj(IR::Instr* instr)
{
    //  MOV dst, undefined
    //  MOV instance, functionObject  // functionObject through stack params or src1
    //  CMP [instance], VtableStackScriptFunction
    //  JE  $Done
    //  MOV instance, instance->homeObj
    //  TEST instance, instance
    //  JZ  $Done
    //  MOV dst, instance
    //  $Done:

    Func *func = instr->m_func;

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *testLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *scriptFuncLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    LABELNAMESET(scriptFuncLabel, "ScriptFunctionWithHomeObj");
    IR::Opnd *opndUndefAddress = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);

    IR::RegOpnd *instanceRegOpnd = IR::RegOpnd::New(TyMachPtr, func);

    IR::Opnd *dstOpnd = instr->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    Lowerer::InsertMove(dstOpnd, opndUndefAddress, instr);

    IR::Opnd * functionObjOpnd = nullptr;
    m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Lowerer::InsertMove(instanceRegOpnd, functionObjOpnd, instr);

    IR::Opnd * vtableAddressOpnd = this->LoadVTableValueOpnd(instr, VTableValue::VtableStackScriptFunction);
    IR::BranchInstr* branchInstr = InsertCompareBranch(IR::IndirOpnd::New(instanceRegOpnd, 0, TyMachPtr, func), vtableAddressOpnd,
        Js::OpCode::BrEq_A, true, labelDone, instr);

    InsertObjectPoison(instanceRegOpnd, branchInstr, instr, false);

    if (func->GetJITFunctionBody()->HasHomeObj())
    {
        // Is this a generator function with home obj?
        if (func->GetJITFunctionBody()->IsCoroutine())
        {
            uint32 homeObjectOffset = Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::GetOffsetOfHomeObj();

            // Is this a generator function with home obj and computed name?
            if (func->GetJITFunctionBody()->HasComputedName())
            {
                homeObjectOffset = Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>::GetOffsetOfHomeObj();
            }

            {
                IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, homeObjectOffset, TyMachPtr, func);
                Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
            }

            InsertBranch(Js::OpCode::Br, testLabel, instr);
        }
        else
        {
            IR::RegOpnd* funcObjHasInlineCachesOpnd = IR::RegOpnd::New(TyUint8, instr->m_func);
            this->InsertMove(funcObjHasInlineCachesOpnd, IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunction::GetOffsetOfHasInlineCaches(), TyUint8, instr->m_func), instr);

            IR::BranchInstr* inlineFuncHomObjCompNameBr = InsertTestBranch(funcObjHasInlineCachesOpnd, funcObjHasInlineCachesOpnd, Js::OpCode::BrEq_A, scriptFuncLabel, instr);
            InsertObjectPoison(instanceRegOpnd, inlineFuncHomObjCompNameBr, instr, false);

            if (func->GetJITFunctionBody()->HasComputedName())
            {
                // Is this a function with inline cache, home obj and computed name?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjCompNameOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjCompNameOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
            else
            {
                // Is this a function with inline cache and home obj?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
        }

        instr->InsertBefore(scriptFuncLabel);

        // All other cases
        {
            IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunctionWithHomeObj::GetOffsetOfHomeObj(), TyMachPtr, func);
            Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
        }
    }
    else
    {
        // Even if the function does not have home object in eval cases we still have the LdHomeObj opcode
        InsertBranch(Js::OpCode::Br, labelDone, instr);
    }

    instr->InsertBefore(testLabel);
    InsertTestBranch(instanceRegOpnd, instanceRegOpnd, Js::OpCode::BrEq_A, labelDone, instr);

    Lowerer::InsertMove(dstOpnd, instanceRegOpnd, instr);

    instr->InsertBefore(labelDone);
    instr->Remove();
}